

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

int libtorrent::anon_unknown_1::path_length(bdecode_node *p,error_code *ec)

{
  int iVar1;
  type_t tVar2;
  int iVar3;
  int i;
  int iVar4;
  int iVar5;
  bdecode_node e;
  
  iVar1 = bdecode_node::list_size(p);
  iVar5 = 0;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  iVar4 = 0;
  iVar3 = 0;
  do {
    i = iVar3;
    if (iVar5 == i) break;
    bdecode_node::list_at(&e,p,i);
    tVar2 = bdecode_node::type(&e);
    if (tVar2 == string_t) {
      iVar3 = bdecode_node::string_length(&e);
      iVar4 = iVar4 + iVar3;
    }
    else {
      boost::system::error_code::operator=(ec,torrent_invalid_name);
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&e);
    iVar3 = i + 1;
  } while (tVar2 == string_t);
  iVar5 = -1;
  if (iVar1 <= i) {
    iVar5 = iVar4 + iVar1;
  }
  return iVar5;
}

Assistant:

int path_length(bdecode_node const& p, error_code& ec)
	{
		int ret = 0;
		int const len = p.list_size();
		for (int i = 0; i < len; ++i)
		{
			bdecode_node const e = p.list_at(i);
			if (e.type() != bdecode_node::string_t)
			{
				ec = errors::torrent_invalid_name;
				return -1;
			}
			ret += e.string_length();
		}
		return ret + len;
	}